

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

QVariant * __thiscall
QInputMethodQueryEvent::value
          (QVariant *__return_storage_ptr__,QInputMethodQueryEvent *this,InputMethodQuery query)

{
  QueryPair *pQVar1;
  ulong uVar2;
  QueryPair *pQVar3;
  QueryPair *pQVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = (this->m_values).d.size;
  bVar6 = uVar2 != 0;
  if (bVar6) {
    pQVar4 = (this->m_values).d.ptr;
    if (pQVar4->query != query) {
      uVar5 = 0;
      pQVar3 = pQVar4;
      do {
        if (uVar2 - 1 == uVar5) goto LAB_002c5f90;
        pQVar4 = pQVar3 + 1;
        uVar5 = uVar5 + 1;
        pQVar1 = pQVar3 + 1;
        pQVar3 = pQVar4;
      } while (pQVar1->query != query);
      bVar6 = uVar5 < uVar2;
    }
    ::QVariant::QVariant(__return_storage_ptr__,&pQVar4->value);
    if (bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_002c5f90:
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QInputMethodQueryEvent::value(Qt::InputMethodQuery query) const
{
    for (int i = 0; i < m_values.size(); ++i)
        if (m_values.at(i).query == query)
            return m_values.at(i).value;
    return QVariant();
}